

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int I400ToARGBMatrix(uint8_t *src_y,int src_stride_y,uint8_t *dst_argb,int dst_stride_argb,
                    YuvConstants *yuvconstants,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *I400ToARGBRow;
  int y;
  code *pcVar2;
  int local_38;
  uint local_34;
  int local_24;
  long local_20;
  uint local_14;
  long local_10;
  int local_4;
  
  pcVar2 = I400ToARGBRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R9D < 1)) || ((int)I400ToARGBRow == 0)) {
    local_4 = -1;
  }
  else {
    local_24 = in_ECX;
    local_20 = in_RDX;
    if ((int)I400ToARGBRow < 0) {
      I400ToARGBRow._0_4_ = -(int)I400ToARGBRow;
      local_20 = in_RDX + ((int)I400ToARGBRow + -1) * in_ECX;
      local_24 = -in_ECX;
    }
    local_34 = in_R9D;
    local_14 = in_ESI;
    if ((in_ESI == in_R9D) && (local_24 == in_R9D << 2)) {
      local_34 = (int)I400ToARGBRow * in_R9D;
      I400ToARGBRow._0_4_ = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I400ToARGBRow_Any_SSE2, (local_34 & 7) == 0)) {
      pcVar2 = I400ToARGBRow_SSE2;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I400ToARGBRow_Any_AVX2, (local_34 & 0xf) == 0)) {
      pcVar2 = I400ToARGBRow_AVX2;
    }
    local_10 = in_RDI;
    for (local_38 = 0; local_38 < (int)I400ToARGBRow; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,in_R8,local_34);
      local_20 = local_20 + local_24;
      local_10 = local_10 + (int)local_14;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I400ToARGBMatrix(const uint8_t* src_y,
                     int src_stride_y,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I400ToARGBRow)(const uint8_t* y_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I400ToARGBRow_C;
  if (!src_y || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_argb = 0;
  }
#if defined(HAS_I400TOARGBROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    I400ToARGBRow = I400ToARGBRow_Any_SSE2;
    if (IS_ALIGNED(width, 8)) {
      I400ToARGBRow = I400ToARGBRow_SSE2;
    }
  }
#endif
#if defined(HAS_I400TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I400ToARGBRow = I400ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I400ToARGBRow = I400ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I400TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I400ToARGBRow = I400ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I400ToARGBRow = I400ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_I400TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I400ToARGBRow = I400ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      I400ToARGBRow = I400ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_I400TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I400ToARGBRow = I400ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      I400ToARGBRow = I400ToARGBRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I400ToARGBRow(src_y, dst_argb, yuvconstants, width);
    dst_argb += dst_stride_argb;
    src_y += src_stride_y;
  }
  return 0;
}